

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O0

uint64_t pstore::lock_block::chars_to_uint64
                   (char c1,char c2,char c3,char c4,char c5,char c6,char c7,char c8)

{
  char c6_local;
  char c5_local;
  char c4_local;
  char c3_local;
  char c2_local;
  char c1_local;
  
  return (long)c1 | (long)c2 << 8 | (long)c3 << 0x10 | (long)c4 << 0x18 | (long)c5 << 0x20 |
         (long)c6 << 0x28 | (long)c7 << 0x30 | (long)c8 << 0x38;
}

Assistant:

static constexpr std::uint64_t chars_to_uint64 (char const c1, char const c2, char const c3,
                                                        char const c4, char const c5, char const c6,
                                                        char const c7, char const c8) noexcept {
            return static_cast<std::uint64_t> (c1) | static_cast<std::uint64_t> (c2) << 8U |
                   static_cast<std::uint64_t> (c3) << 16U | static_cast<std::uint64_t> (c4) << 24U |
                   static_cast<std::uint64_t> (c5) << 32U | static_cast<std::uint64_t> (c6) << 40U |
                   static_cast<std::uint64_t> (c7) << 48U | static_cast<std::uint64_t> (c8) << 56U;
        }